

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcre2_jit_match.c
# Opt level: O3

int jit_machine_stack_exec(jit_arguments *arguments,jit_function executable_func)

{
  int iVar1;
  sljit_stack local_stack;
  sljit_u8 local_space [32768];
  sljit_stack local_8028;
  sljit_u8 local_8008 [32768];
  sljit_u8 local_8 [8];
  
  local_8028.start = local_8008;
  local_8028.top = local_8;
  arguments->stack = &local_8028;
  local_8028.end = local_8028.top;
  local_8028.min_start = local_8028.start;
  iVar1 = (*executable_func)(arguments);
  return iVar1;
}

Assistant:

static SLJIT_NOINLINE int jit_machine_stack_exec(jit_arguments *arguments, jit_function executable_func)
{
sljit_u8 local_space[MACHINE_STACK_SIZE];
struct sljit_stack local_stack;

local_stack.min_start = local_space;
local_stack.start = local_space;
local_stack.end = local_space + MACHINE_STACK_SIZE;
local_stack.top = local_space + MACHINE_STACK_SIZE;
arguments->stack = &local_stack;
return executable_func(arguments);
}